

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
               (void)

{
  pointer puVar1;
  Column_settings *pCVar2;
  Column_settings *pCVar3;
  pointer pvVar4;
  uint local_324;
  uint *local_320;
  uint *local_318;
  uint local_30c;
  undefined1 local_308 [8];
  undefined8 local_300;
  shared_count sStack_2f8;
  undefined **local_2f0;
  undefined1 local_2e8;
  undefined8 *local_2e0;
  uint **local_2d8;
  undefined **local_2d0;
  undefined1 local_2c8;
  undefined8 *local_2c0;
  uint **local_2b8;
  undefined **local_2b0;
  undefined1 local_2a8;
  undefined8 *local_2a0;
  char *local_298;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
            (&columns,&m);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x359);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001f2110;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_318 = &local_324;
  local_324 = (uint)m.matrix_.matrix_._M_h._M_element_count;
  local_320 = &local_30c;
  local_30c = 7;
  local_308[0] = (uint)m.matrix_.matrix_._M_h._M_element_count == 7;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_2b8 = &local_318;
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001f2080;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = &local_320;
  local_2e8 = 0;
  local_2f0 = &PTR__lazy_ostream_001f20d0;
  local_2e0 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x35b);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001f2110;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  local_318 = &m.matrix_.super_Base_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_324 = 6;
  local_308[0] = m.matrix_.super_Base_pairing_option.barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].death == 6;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001f2080;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_318;
  local_320 = &local_324;
  local_2e8 = 0;
  local_2f0 = &PTR__lazy_ostream_001f20d0;
  local_2e0 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = &local_320;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_2b0,&local_278,0x35b,1,2,2,"m.get_current_barcode().back().death",
             &local_2d0,"6",&local_2f0);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
  ::remove_last(&m.matrix_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar1 != (pointer)0x0) {
    pvVar4 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar1,(long)(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    pvVar4 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
            (&columns,&m);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x363);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001f2110;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  local_324 = (uint)m.matrix_.matrix_._M_h._M_element_count;
  local_308[0] = (uint)m.matrix_.matrix_._M_h._M_element_count == 6;
  local_30c = 6;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_318 = &local_324;
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001f2080;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_318;
  local_320 = &local_30c;
  local_2e8 = 0;
  local_2f0 = &PTR__lazy_ostream_001f20d0;
  local_2e0 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = &local_320;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x364);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_001f2110;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = "";
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  local_318 = &m.matrix_.super_Base_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_324 = 0xffffffff;
  local_308[0] = m.matrix_.super_Base_pairing_option.barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].death == 0xffffffff;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_001f2080;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_318;
  local_320 = &local_324;
  local_2e8 = 0;
  local_2f0 = &PTR__lazy_ostream_001f2080;
  local_2e0 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = &local_320;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_2b0,&local_278,0x364,1,2,2,"m.get_current_barcode().back().death",
             &local_2d0,"Matrix::template get_null_value<typename Matrix::ID_index>()",&local_2f0);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  pCVar2 = m.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&m.matrix_.matrix_._M_h);
  pCVar3 = m.colSettings_;
  m.matrix_.nextInsertIndex_ = 0;
  m.matrix_.colSettings_ = pCVar2;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
  }
  operator_delete(pCVar3,0x38);
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
  ::~Boundary_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_boundary_maximal_simplex_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  // pairing always true for boundary for now (only thing differentiating it from base)
  BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);

  m.remove_last();

  columns.pop_back();
  columns[5].clear();  // was reduced

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, Matrix::template get_null_value<typename Matrix::ID_index>());
}